

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArraySamplingTest::setupSharedStorageBuffers
          (TextureCubeMapArraySamplingTest *this,formatDefinition *format,
          samplingFunction *sampling_function,bufferCollection *buffers,GLuint program_id)

{
  uint local_50;
  uint local_4c;
  GLuint i_1;
  GLuint i;
  attributeDefinition *routine_attributes;
  GLuint n_routine_attributes;
  GLuint n_format_attributes;
  attributeDefinition *format_attributes;
  bufferCollection *pbStack_28;
  GLuint program_id_local;
  bufferCollection *buffers_local;
  samplingFunction *sampling_function_local;
  formatDefinition *format_local;
  TextureCubeMapArraySamplingTest *this_local;
  
  _n_routine_attributes = (attributeDefinition *)0x0;
  routine_attributes._4_4_ = 0;
  routine_attributes._0_4_ = 0;
  _i_1 = (attributeDefinition *)0x0;
  format_attributes._4_4_ = program_id;
  pbStack_28 = buffers;
  buffers_local = (bufferCollection *)sampling_function;
  sampling_function_local = (samplingFunction *)format;
  format_local = (formatDefinition *)this;
  getAttributes(format->m_sampler_type,(attributeDefinition **)&n_routine_attributes,
                (GLuint *)((long)&routine_attributes + 4));
  getAttributes(*(samplingFunction *)&(buffers_local->postion).m_gl,(attributeDefinition **)&i_1,
                (GLuint *)&routine_attributes);
  for (local_4c = 0; local_4c < (uint)routine_attributes; local_4c = local_4c + 1) {
    setupSharedStorageBuffer(this,_i_1 + local_4c,pbStack_28,format_attributes._4_4_);
  }
  for (local_50 = 0; local_50 < routine_attributes._4_4_; local_50 = local_50 + 1) {
    setupSharedStorageBuffer
              (this,_n_routine_attributes + local_50,pbStack_28,format_attributes._4_4_);
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::setupSharedStorageBuffers(const formatDefinition& format,
																const samplingFunction& sampling_function,
																const bufferCollection& buffers, glw::GLuint program_id)
{
	const attributeDefinition* format_attributes	= 0;
	glw::GLuint				   n_format_attributes  = 0;
	glw::GLuint				   n_routine_attributes = 0;
	const attributeDefinition* routine_attributes   = 0;

	getAttributes(format.m_sampler_type, format_attributes, n_format_attributes);
	getAttributes(sampling_function, routine_attributes, n_routine_attributes);

	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		setupSharedStorageBuffer(routine_attributes[i], buffers, program_id);
	}

	for (glw::GLuint i = 0; i < n_format_attributes; ++i)
	{
		setupSharedStorageBuffer(format_attributes[i], buffers, program_id);
	}
}